

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrFreeNtk(Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  if (1 < vNtk->nSize) {
    pvVar1 = vNtk->pArray[1];
    pvVar2 = *(void **)((long)pvVar1 + 8);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
    }
    free(pvVar1);
    if (2 < vNtk->nSize) {
      pvVar1 = vNtk->pArray[2];
      pvVar2 = *(void **)((long)pvVar1 + 8);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      free(pvVar1);
      if (3 < vNtk->nSize) {
        pvVar1 = vNtk->pArray[3];
        iVar3 = *(int *)((long)pvVar1 + 4);
        if (0 < iVar3) {
          lVar4 = 0;
          do {
            pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + lVar4 * 8);
            if (pvVar2 != (void *)0x0) {
              if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar2 + 8));
              }
              free(pvVar2);
              iVar3 = *(int *)((long)pvVar1 + 4);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < iVar3);
        }
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
        }
        free(pvVar1);
        if (4 < vNtk->nSize) {
          pvVar1 = vNtk->pArray[4];
          iVar3 = *(int *)((long)pvVar1 + 4);
          if (0 < iVar3) {
            lVar4 = 0;
            do {
              pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + lVar4 * 8);
              if (pvVar2 != (void *)0x0) {
                if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar2 + 8));
                }
                free(pvVar2);
                iVar3 = *(int *)((long)pvVar1 + 4);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < iVar3);
          }
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          if (5 < vNtk->nSize) {
            pvVar1 = vNtk->pArray[5];
            pvVar2 = *(void **)((long)pvVar1 + 8);
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
            free(pvVar1);
            if (6 < vNtk->nSize) {
              pvVar1 = vNtk->pArray[6];
              pvVar2 = *(void **)((long)pvVar1 + 8);
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
              free(pvVar1);
            }
          }
          if (vNtk->pArray != (void **)0x0) {
            free(vNtk->pArray);
          }
          free(vNtk);
          return;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrFreeNtk( Vec_Ptr_t * vNtk )
{
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 3) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 4) );
    if ( Vec_PtrSize(vNtk) > 5 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 5) );
    if ( Vec_PtrSize(vNtk) > 6 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 6) );
    Vec_PtrFree( vNtk );
}